

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O1

void __thiscall
Assimp::UnrealImporter::InternReadFile
          (UnrealImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int8_t **ppiVar1;
  char *__s;
  undefined1 uVar2;
  uint uVar3;
  size_t __n;
  pointer __n_00;
  bool bVar4;
  _Alloc_hider _Var5;
  MeshFlags *pMVar6;
  float fVar7;
  SharedPostProcessInfo *pSVar8;
  char cVar9;
  uchar uVar10;
  byte bVar11;
  ushort uVar12;
  ushort uVar13;
  short sVar14;
  uint i_2;
  int iVar15;
  uint uVar16;
  Logger *pLVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar18;
  undefined4 extraout_var_02;
  aiNode *this_01;
  IOStream *stream;
  ulong uVar19;
  pointer __s2;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  _Var20;
  aiMesh **ppaVar21;
  aiMaterial **ppaVar22;
  uint *puVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  aiMaterial *this_02;
  size_t sVar28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar29;
  runtime_error *prVar30;
  char cVar31;
  float *pfVar32;
  aiFace *paVar33;
  aiVector3t<float> *vertex;
  pointer paVar34;
  pointer pTVar35;
  UnrealImporter *pUVar36;
  pointer pTVar37;
  uint i2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar38;
  long lVar39;
  pointer pTVar40;
  uint i_1;
  uint i;
  long lVar41;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> materials;
  int twosided;
  string uc_path;
  FlipWindingOrderProcess flipper;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> triangles;
  StreamReaderLE d_reader;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  textures;
  string extension;
  string a_path;
  string d_path;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  MakeLeftHandedProcess hero;
  StreamReaderLE a_reader;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> local_5e8;
  UnrealImporter *local_5d0;
  UnrealImporter *local_5c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5b8;
  undefined4 local_5ac;
  char *local_5a8;
  long local_5a0;
  char local_598;
  undefined7 uStack_597;
  FlipWindingOrderProcess local_588;
  aiNode *local_568;
  UnrealImporter *local_560;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> local_558;
  StreamReader<false,_false> local_540;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_508;
  string local_4e8;
  char *local_4c8;
  long local_4c0;
  char local_4b8;
  undefined7 uStack_4b7;
  char *local_4a8;
  long local_4a0;
  char local_498;
  undefined7 uStack_497;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_488;
  undefined1 local_470 [12];
  char acStack_464 [4];
  undefined1 local_460 [24];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440 [4];
  ios_base local_400 [920];
  StreamReader<false,_false> local_68;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  local_5c8 = this;
  local_5b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pIOHandler;
  std::__cxx11::string::rfind((char)pFile,0x2e);
  BaseImporter::GetExtension(&local_4e8,pFile);
  local_4a8 = &local_498;
  local_4a0 = 0;
  local_498 = '\0';
  local_4c8 = &local_4b8;
  local_4c0 = 0;
  local_4b8 = '\0';
  local_5a8 = &local_598;
  local_5a0 = 0;
  local_598 = '\0';
  iVar15 = std::__cxx11::string::compare((char *)&local_4e8);
  if (iVar15 == 0) {
    lVar41 = std::__cxx11::string::rfind((char)pFile,0x5f);
    if (lVar41 == -1) {
      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_470._0_8_ = local_460;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_470,"UNREAL: Unexpected naming scheme","");
      std::runtime_error::runtime_error(prVar30,(string *)local_470);
      *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
      __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  else {
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_470);
  if ((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_) != local_460) {
    operator_delete((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_),local_460._0_8_ + 1);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_4e8._M_dataplus._M_p,
             local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_4e8._M_dataplus._M_p,
             local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_4e8._M_dataplus._M_p,
             local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  pLVar17 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: data file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4a8,local_4a0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar17,(char *)local_540.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  ppiVar1 = &local_540.buffer;
  if (local_540.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar1) {
    operator_delete(local_540.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_540.buffer + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar17 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: aniv file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4c8,local_4c0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar17,(char *)local_540.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_540.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar1) {
    operator_delete(local_540.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_540.buffer + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar17 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[20]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [20])"UNREAL: uc file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_5a8,local_5a0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar17,(char *)local_540.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_540.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar1) {
    operator_delete(local_540.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_540.buffer + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar15 = (**(_func_int **)((long)(local_5b8->first)._M_dataplus._M_p + 0x20))
                     (local_5b8,local_4a8,local_470._0_8_);
  local_5d0 = (UnrealImporter *)CONCAT44(extraout_var,iVar15);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  if (local_5d0 == (UnrealImporter *)0x0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _d file","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar15 = (**(_func_int **)((long)(local_5b8->first)._M_dataplus._M_p + 0x20))
                     (local_5b8,local_4a8,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_540,(IOStream *)CONCAT44(extraout_var_00,iVar15),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  uVar12 = StreamReader<false,_false>::Get<short>(&local_540);
  uVar13 = StreamReader<false,_false>::Get<short>(&local_540);
  StreamReader<false,_false>::IncPtr(&local_540,0x2c);
  if ((uVar12 == 0) || (uVar13 < 3)) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Invalid number of vertices/triangles","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_560 = (UnrealImporter *)CONCAT62(local_560._2_6_,uVar13);
  std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::vector
            (&local_558,(ulong)uVar12,(allocator_type *)local_470);
  local_568 = (aiNode *)
              local_558.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_558.
                  super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                  ._M_impl.super__Vector_impl_data._M_start)->mTex;
    pTVar37 = local_558.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar41 = 0;
      do {
        uVar13 = StreamReader<false,_false>::Get<short>(&local_540);
        pTVar37->mVertex[lVar41] = uVar13;
        if (uVar12 <= uVar13) {
          pLVar17 = DefaultLogger::get();
          Logger::warn(pLVar17,"UNREAL: vertex index out of range");
          pTVar37->mVertex[lVar41] = 0;
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != 3);
      cVar9 = StreamReader<false,_false>::Get<signed_char>(&local_540);
      pTVar37->mType = cVar9;
      if (local_5c8->configHandleFlags == false) {
        cVar31 = '\x01';
        if ((byte)(cVar9 - 3U) < 2) goto LAB_005a74bc;
      }
      else {
        cVar31 = '\0';
LAB_005a74bc:
        pTVar37->mType = cVar31;
      }
      StreamReader<false,_false>::IncPtr(&local_540,1);
      lVar41 = 0;
      local_5c0 = ppVar38;
      do {
        lVar39 = 0;
        do {
          cVar9 = StreamReader<false,_false>::Get<signed_char>(&local_540);
          *(char *)((long)&(ppVar38->first)._M_dataplus._M_p + lVar39) = cVar9;
          lVar39 = lVar39 + 1;
        } while (lVar39 == 1);
        lVar41 = lVar41 + 1;
        ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&(ppVar38->first)._M_dataplus._M_p + 2);
      } while (lVar41 != 3);
      uVar10 = StreamReader<false,_false>::Get<signed_char>(&local_540);
      ppVar38 = local_5c0;
      pTVar37->mTextureNum = uVar10;
      StreamReader<false,_false>::IncPtr(&local_540,1);
      pTVar37 = pTVar37 + 1;
      ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&(ppVar38->first).field_2 + 4);
    } while ((aiNode *)pTVar37 != local_568);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar15 = (**(_func_int **)((long)(local_5b8->first)._M_dataplus._M_p + 0x20))
                     (local_5b8,local_4c8,local_470._0_8_);
  plVar18 = (long *)CONCAT44(extraout_var_01,iVar15);
  (*(local_5d0->super_BaseImporter)._vptr_BaseImporter[1])();
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  if (plVar18 == (long *)0x0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _a file","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar15 = (**(_func_int **)((long)(local_5b8->first)._M_dataplus._M_p + 0x20))
                     (local_5b8,local_4c8,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_68,(IOStream *)CONCAT44(extraout_var_02,iVar15),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  sVar14 = StreamReader<false,_false>::Get<short>(&local_68);
  if ((uint)(int)sVar14 <= local_5c8->configFrameID) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: The requested frame does not exist","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar14 = StreamReader<false,_false>::Get<short>(&local_68);
  uVar19 = (ulong)local_560 & 0xffff;
  if ((uint)(ushort)local_560 * 4 != (int)sVar14) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unexpected aniv file length","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::IncPtr
            (&local_68,(ulong)(local_5c8->configFrameID * (uint)(ushort)local_560 * 4));
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&local_488,uVar19,(allocator_type *)local_470);
  if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar34 = local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar15 = StreamReader<false,_false>::Get<int>(&local_68);
      paVar34->x = (float)((iVar15 << 0x15) >> 0x15);
      paVar34->y = (float)((iVar15 << 10) >> 0x15);
      paVar34->z = (float)(iVar15 >> 0x16);
      paVar34 = paVar34 + 1;
    } while (paVar34 !=
             local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_508.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  pScene->mRootNode = this_01;
  (this_01->mName).length = 0xc;
  builtin_strncpy((this_01->mName).data,"<UnrealRoot>",0xd);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar15 = (**(_func_int **)((long)(local_5b8->first)._M_dataplus._M_p + 0x20))
                     (local_5b8,local_5a8,local_470._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var_03,iVar15);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
  }
  local_568 = this_01;
  if (stream == (IOStream *)0x0) {
    pLVar17 = DefaultLogger::get();
    Logger::error(pLVar17,"Unable to open .uc file");
  }
  else {
    local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer
              (stream,(vector<char,_std::allocator<char>_> *)&local_5e8,FORBID_EMPTY);
    local_588.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
    local_588.super_BaseProcess.shared = (SharedPostProcessInfo *)0x0;
    local_588.super_BaseProcess.progress = (ProgressHandler *)0x0;
    if ((char)(local_5e8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_start)->type != MF_NORMAL_OS) {
      local_5c8 = (UnrealImporter *)&(local_568->mTransformation).c3;
      pfVar32 = &(local_568->mTransformation).b2;
      local_560 = (UnrealImporter *)&local_568->mTransformation;
      __s2 = local_5e8.
             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
             _M_impl.super__Vector_impl_data._M_start;
      local_5d0 = (UnrealImporter *)pfVar32;
      do {
        iVar15 = strncasecmp("#exec",(char *)__s2,5);
        if (iVar15 == 0) {
          pfVar32 = (float *)(ulong)*(byte *)((long)&__s2->tex + 1);
          bVar4 = false;
          if ((pfVar32 < (float *)0x21) && ((0x100003601U >> ((ulong)pfVar32 & 0x3f) & 1) != 0)) {
            __s2 = (pointer)((long)&__s2->tex + 2);
            bVar4 = true;
          }
        }
        else {
          bVar4 = false;
        }
        if (bVar4) {
          while ((uVar19 = (ulong)(byte)(char)__s2->type, uVar19 < 0x21 &&
                 ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0))) {
            __s2 = (pointer)((long)&__s2->type + 1);
          }
          iVar15 = strncasecmp("TEXTURE",(char *)__s2,7);
          if (((iVar15 == 0) && (uVar19 = (ulong)*(byte *)((long)&__s2->tex + 3), uVar19 < 0x21)) &&
             ((0x100003601U >> (uVar19 & 0x3f) & 1) != 0)) {
            __s2 = (pointer)&__s2->numFaces;
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
          if (bVar4) {
            while ((uVar19 = (ulong)(byte)(char)__s2->type, uVar19 < 0x21 &&
                   ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0))) {
              __s2 = (pointer)((long)&__s2->type + 1);
            }
            iVar15 = strncasecmp("IMPORT",(char *)__s2,6);
            if (((iVar15 == 0) && (uVar19 = (ulong)*(byte *)((long)&__s2->tex + 2), uVar19 < 0x21))
               && ((0x100003601U >> (uVar19 & 0x3f) & 1) != 0)) {
              __s2 = (pointer)((long)&__s2->tex + 3);
              bVar4 = true;
            }
            else {
              bVar4 = false;
            }
            if (bVar4) {
              local_470._8_4_ = 0;
              acStack_464[0] = '\0';
              acStack_464[1] = '\0';
              acStack_464[2] = '\0';
              acStack_464[3] = '\0';
              local_460._0_8_ = local_460._0_8_ & 0xffffffffffffff00;
              local_448 = 0;
              local_440[0]._M_local_buf[0] = '\0';
              local_460._16_8_ = local_440;
              local_470._0_8_ = local_460;
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_588,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_470);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._16_8_ != local_440) {
                operator_delete((void *)local_460._16_8_,
                                CONCAT71(local_440[0]._M_allocated_capacity._1_7_,
                                         local_440[0]._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_470._0_8_ != local_460) {
                operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
              }
              pSVar8 = local_588.super_BaseProcess.shared;
              local_5c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)local_588.super_BaseProcess.shared + -0x40);
              local_5b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)local_588.super_BaseProcess.shared + -0x40))->second;
              while ((uVar16 = (uint)(byte)(char)__s2->type, 0xd < uVar16 ||
                     (pfVar32 = (float *)0x3401, (0x3401U >> (uVar16 & 0x1f) & 1) == 0))) {
                iVar15 = strncasecmp((char *)__s2,"NAME=",5);
                if (iVar15 == 0) {
                  pTVar40 = (pointer)((long)&__s2->tex + 1);
                  __s2 = pTVar40;
                  while ((uVar19 = (ulong)(byte)(char)__s2->type, 0x20 < uVar19 ||
                         ((0x100003601U >> (uVar19 & 0x3f) & 1) == 0))) {
                    __s2 = (pointer)((long)&__s2->type + 1);
                  }
                  local_470._0_8_ = local_460;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,pTVar40,__s2);
                  ppVar38 = local_5c0;
LAB_005a7b06:
                  std::__cxx11::string::operator=((string *)ppVar38,(string *)local_470);
                  if ((undefined1 *)local_470._0_8_ != local_460) {
                    operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
                  }
                }
                else {
                  iVar15 = strncasecmp((char *)__s2,"FILE=",5);
                  if (iVar15 == 0) {
                    pTVar40 = (pointer)((long)&__s2->tex + 1);
                    __s2 = pTVar40;
                    while ((uVar19 = (ulong)(byte)(char)__s2->type, 0x20 < uVar19 ||
                           ((0x100003601U >> (uVar19 & 0x3f) & 1) == 0))) {
                      __s2 = (pointer)((long)&__s2->type + 1);
                    }
                    local_470._0_8_ = local_460;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_470,pTVar40,__s2);
                    ppVar38 = local_5b8;
                    goto LAB_005a7b06;
                  }
                }
                __s2 = (pointer)((long)&__s2->type + 1);
              }
              if (((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)pSVar8 + -0x40))->first)._M_string_length == 0) ||
                 ((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)pSVar8 + -0x40))->second)._M_string_length == 0)) {
                local_588.super_BaseProcess.shared =
                     (SharedPostProcessInfo *)((long)local_588.super_BaseProcess.shared + -0x40);
                __gnu_cxx::new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>::
                destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>> *)
                           &local_588,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_588.super_BaseProcess.shared);
              }
            }
          }
          else {
            iVar15 = strncasecmp("MESHMAP",(char *)__s2,7);
            if (iVar15 == 0) {
              pfVar32 = (float *)(ulong)*(byte *)((long)&__s2->tex + 3);
              bVar4 = false;
              if ((pfVar32 < (float *)0x21) && ((0x100003601U >> ((ulong)pfVar32 & 0x3f) & 1) != 0))
              {
                __s2 = (pointer)&__s2->numFaces;
                bVar4 = true;
              }
            }
            else {
              bVar4 = false;
            }
            if (bVar4) {
              while ((uVar19 = (ulong)(byte)(char)__s2->type, uVar19 < 0x21 &&
                     ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0))) {
                __s2 = (pointer)((long)&__s2->type + 1);
              }
              iVar15 = strncasecmp("SETTEXTURE",(char *)__s2,10);
              if (((iVar15 == 0) &&
                  (uVar19 = (ulong)*(byte *)((long)&__s2->numFaces + 2), uVar19 < 0x21)) &&
                 ((0x100003601U >> (uVar19 & 0x3f) & 1) != 0)) {
                __s2 = (pointer)((long)&__s2->numFaces + 3);
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
              if (bVar4) {
                local_470._0_4_ = MF_NORMAL_OS;
                local_460._0_8_ = 0;
                local_460[8] = '\0';
                unique0x10003410 = local_460 + 8;
                std::
                vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
                          ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                            *)&local_508,
                           (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_470);
                if (stack0xfffffffffffffb98 != local_460 + 8) {
                  operator_delete(stack0xfffffffffffffb98,CONCAT71(local_460._9_7_,local_460[8]) + 1
                                 );
                }
                local_5c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_508.
                               super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                this_00 = &((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)local_508.
                                      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -0x40))->second;
                while ((uVar16 = (uint)(byte)(char)__s2->type, 0xd < uVar16 ||
                       (pfVar32 = (float *)0x3401, (0x3401U >> (uVar16 & 0x1f) & 1) == 0))) {
                  iVar15 = strncasecmp((char *)__s2,"NUM=",4);
                  if (iVar15 == 0) {
                    bVar11 = (byte)__s2->tex;
                    __s2 = (pointer)&__s2->tex;
                    iVar15 = 0;
                    if (0xf5 < (byte)(bVar11 - 0x3a)) {
                      iVar15 = 0;
                      do {
                        iVar15 = (uint)(byte)(bVar11 - 0x30) + iVar15 * 10;
                        bVar11 = *(byte *)((long)&__s2->type + 1);
                        __s2 = (pointer)((long)&__s2->type + 1);
                      } while (0xf5 < (byte)(bVar11 - 0x3a));
                    }
                    *(int *)((long)&local_5c0[-1].first.field_2 + 8) = iVar15;
                  }
                  else {
                    iVar15 = strncasecmp((char *)__s2,"TEXTURE=",8);
                    if (iVar15 == 0) {
                      puVar23 = &__s2->numFaces;
                      __s2 = (pointer)puVar23;
                      while ((uVar19 = (ulong)(byte)(char)__s2->type, 0x20 < uVar19 ||
                             ((0x100003601U >> (uVar19 & 0x3f) & 1) == 0))) {
                        __s2 = (pointer)((long)&__s2->type + 1);
                      }
                      local_470._0_8_ = local_460;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_470,puVar23,__s2);
                      std::__cxx11::string::operator=((string *)this_00,(string *)local_470);
                      if ((undefined1 *)local_470._0_8_ != local_460) {
                        operator_delete((void *)local_470._0_8_,local_460._0_8_ + 1);
                      }
                      pSVar8 = local_588.super_BaseProcess.shared;
                      if ((SharedPostProcessInfo *)local_588.super_BaseProcess._vptr_BaseProcess !=
                          local_588.super_BaseProcess.shared) {
                        sVar28 = local_5c0[-1].second._M_string_length;
                        ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_588.super_BaseProcess._vptr_BaseProcess;
                        do {
                          __n = (ppVar38->first)._M_string_length;
                          if (__n == sVar28) {
                            if (__n != 0) {
                              iVar15 = bcmp((ppVar38->first)._M_dataplus._M_p,
                                            (this_00->_M_dataplus)._M_p,__n);
                              if (iVar15 != 0) goto LAB_005a7d6e;
                            }
                            std::__cxx11::string::_M_assign((string *)this_00);
                            break;
                          }
LAB_005a7d6e:
                          ppVar38 = ppVar38 + 1;
                        } while (ppVar38 !=
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pSVar8);
                      }
                    }
                  }
                  __s2 = (pointer)((long)&__s2->type + 1);
                }
              }
              else {
                iVar15 = strncasecmp("SCALE",(char *)__s2,5);
                if (iVar15 == 0) {
                  pfVar32 = (float *)(ulong)*(byte *)((long)&__s2->tex + 1);
                  bVar4 = false;
                  if ((pfVar32 < (float *)0x21) &&
                     ((0x100003601U >> ((ulong)pfVar32 & 0x3f) & 1) != 0)) {
                    __s2 = (pointer)((long)&__s2->tex + 2);
                    bVar4 = true;
                  }
                }
                else {
                  bVar4 = false;
                }
                if (bVar4) {
                  do {
                    uVar2 = (undefined1)__s2->type;
                    if ((byte)uVar2 < 0x59) {
                      if (uVar2 == 0x58) {
                        bVar11 = *(byte *)((long)&__s2->type + 1);
                        pUVar36 = local_560;
                        goto joined_r0x005a7e2c;
                      }
                      if (((byte)uVar2 < (MF_WEAPON_PLACEHOLDER|MF_NORMAL_MOD_TS|MF_NORMAL_TRANS_TS)
                          ) && (pfVar32 = (float *)0x3401,
                               (0x3401U >> ((byte)uVar2 & 0x1f) & 1) != 0)) break;
                    }
                    else {
                      if (uVar2 == 0x59) {
                        bVar11 = *(byte *)((long)&__s2->type + 1);
                        pUVar36 = local_5d0;
joined_r0x005a7e2c:
                        if (bVar11 != 0x3d) goto joined_r0x005a7e5b;
                      }
                      else {
joined_r0x005a7e5b:
                        if (((byte)uVar2 != 0x5a) ||
                           (pUVar36 = local_5c8, *(byte *)((long)&__s2->type + 1) != 0x3d))
                        goto LAB_005a7e42;
                      }
                      __s2 = (pointer)fast_atoreal_move<float>
                                                ((Assimp *)((long)&__s2->type + 2),(char *)pUVar36,
                                                 (float *)0x1,SUB81(pfVar32,0));
                    }
LAB_005a7e42:
                    __s2 = (pointer)((long)&__s2->type + 1);
                  } while( true );
                }
              }
            }
          }
        }
        pMVar6 = &__s2->type;
        __s2 = (pointer)((long)&__s2->type + 1);
      } while (*(byte *)((long)pMVar6 + 1) != 0);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_588);
    this_01 = local_568;
    if (local_5e8.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.
                      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.
                            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.
                            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      this_01 = local_568;
    }
  }
  local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (TempMat *)0x0;
  local_5e8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (TempMat *)0x0;
  std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::reserve
            (&local_5e8,
             ((long)local_508.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_508.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x6666666666666666 + 5);
  pTVar37 = local_558.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar35 = local_558.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_470._0_4_ = SEXT14(pTVar35->mType);
      local_470._4_4_ = ZEXT14(pTVar35->mTextureNum);
      local_470._8_4_ = 0;
      _Var20 = std::
               __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                         (local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
      if (_Var20._M_current ==
          local_5e8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pTVar35->matIndex =
             (int)((ulong)((long)local_5e8.
                                 super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_5e8.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        local_470._8_4_ = 1;
        if (local_5e8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_5e8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>::
          _M_realloc_insert<Assimp::Unreal::TempMat_const&>
                    ((vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>> *)
                     &local_5e8,
                     (iterator)
                     local_5e8.
                     super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
        }
        else {
          (local_5e8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->numFaces = 1;
          (local_5e8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = local_470._0_4_;
          (local_5e8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->tex = local_470._4_4_;
          local_5e8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_5e8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      else {
        pTVar35->matIndex =
             (int)((ulong)((long)_Var20._M_current -
                          (long)local_5e8.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        (_Var20._M_current)->numFaces = (_Var20._M_current)->numFaces + 1;
      }
      pTVar35 = pTVar35 + 1;
    } while (pTVar35 != pTVar37);
  }
  uVar16 = pScene->mNumMeshes;
  uVar19 = (ulong)uVar16;
  if (uVar19 == 0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to find valid mesh data","");
    std::runtime_error::runtime_error(prVar30,(string *)local_470);
    *(undefined ***)prVar30 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppaVar21 = (aiMesh **)operator_new__(uVar19 * 8);
  pScene->mMeshes = ppaVar21;
  pScene->mNumMaterials = uVar16;
  ppaVar22 = (aiMaterial **)operator_new__(uVar19 * 8);
  pScene->mMaterials = ppaVar22;
  this_01->mNumMeshes = uVar16;
  puVar23 = (uint *)operator_new__(uVar19 << 2);
  this_01->mMeshes = puVar23;
  _Var5._M_p = stack0xfffffffffffffb98;
  if (pScene->mNumMeshes != 0) {
    ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
    do {
      unique0x10003468 = _Var5._M_p;
      paVar24 = (aiMesh *)operator_new(0x520);
      paVar24->mPrimitiveTypes = 0;
      paVar24->mNumVertices = 0;
      paVar24->mNumFaces = 0;
      memset(&paVar24->mVertices,0,0xcc);
      paVar24->mBones = (aiBone **)0x0;
      paVar24->mMaterialIndex = 0;
      (paVar24->mName).length = 0;
      (paVar24->mName).data[0] = '\0';
      memset((paVar24->mName).data + 1,0x1b,0x3ff);
      paVar24->mNumAnimMeshes = 0;
      paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar24->mMethod = 0;
      (paVar24->mAABB).mMin.x = 0.0;
      (paVar24->mAABB).mMin.y = 0.0;
      (paVar24->mAABB).mMin.z = 0.0;
      (paVar24->mAABB).mMax.x = 0.0;
      (paVar24->mAABB).mMax.y = 0.0;
      (paVar24->mAABB).mMax.z = 0.0;
      paVar24->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar24->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar24->mNumUVComponents[0] = 0;
      paVar24->mNumUVComponents[1] = 0;
      paVar24->mNumUVComponents[2] = 0;
      paVar24->mNumUVComponents[3] = 0;
      paVar24->mNumUVComponents[4] = 0;
      paVar24->mNumUVComponents[5] = 0;
      paVar24->mNumUVComponents[6] = 0;
      paVar24->mNumUVComponents[7] = 0;
      paVar24->mColors[0] = (aiColor4D *)0x0;
      paVar24->mColors[1] = (aiColor4D *)0x0;
      paVar24->mColors[2] = (aiColor4D *)0x0;
      paVar24->mColors[3] = (aiColor4D *)0x0;
      paVar24->mColors[4] = (aiColor4D *)0x0;
      paVar24->mColors[5] = (aiColor4D *)0x0;
      paVar24->mColors[6] = (aiColor4D *)0x0;
      paVar24->mColors[7] = (aiColor4D *)0x0;
      pScene->mMeshes[(long)ppVar38] = paVar24;
      paVar24->mPrimitiveTypes = 4;
      local_5c8 = (UnrealImporter *)((long)ppVar38 * 3);
      uVar16 = local_5e8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar38].numFaces;
      uVar19 = (ulong)uVar16;
      local_5c0 = ppVar38;
      puVar25 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
      *puVar25 = uVar19;
      paVar26 = (aiFace *)(puVar25 + 1);
      if (uVar19 != 0) {
        paVar33 = paVar26;
        do {
          paVar33->mNumIndices = 0;
          paVar33->mIndices = (uint *)0x0;
          paVar33 = paVar33 + 1;
        } while (paVar33 != paVar26 + uVar19);
      }
      paVar24->mFaces = paVar26;
      uVar19 = (ulong)(uVar16 * 3);
      paVar27 = (aiVector3D *)operator_new__(uVar19 * 0xc);
      if (uVar16 != 0) {
        memset(paVar27,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar24->mVertices = paVar27;
      paVar27 = (aiVector3D *)operator_new__(uVar19 * 0xc);
      if (uVar16 != 0) {
        memset(paVar27,0,((uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppVar38 = local_5c0;
      paVar24->mTextureCoords[0] = paVar27;
      local_568->mMeshes[(long)local_5c0] = (uint)local_5c0;
      this_02 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_02);
      __s = local_470 + 4;
      pScene->mMaterials[(long)ppVar38] = this_02;
      local_588.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x3f8000003f800000;
      local_588.super_BaseProcess.shared =
           (SharedPostProcessInfo *)CONCAT44(local_588.super_BaseProcess.shared._4_4_,0x3f800000);
      local_470._0_4_ = MF_NORMAL_OS;
      local_470._4_4_ = local_470._4_4_ & 0xffffff00;
      memset(local_470 + 5,0x1b,0x3ff);
      snprintf(__s,0x400,"mat%u_tx%u_",(ulong)ppVar38 & 0xffffffff);
      if (local_5e8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_start[(long)ppVar38].type == MF_NORMAL_TS) {
        local_5ac = 1;
        aiMaterial::AddBinaryProperty(this_02,&local_5ac,4,"$mat.twosided",0,0,aiPTI_Integer);
        pUVar36 = local_5c8;
        sVar28 = strlen(__s);
        *(undefined4 *)(local_470 + sVar28 + 4) = 0x5f7374;
      }
      else {
        sVar28 = strlen(__s);
        *(undefined4 *)(local_470 + sVar28 + 4) = 0x5f736f;
        pUVar36 = local_5c8;
      }
      if ((&(local_5e8.
             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
             _M_impl.super__Vector_impl_data._M_start)->type)[(long)pUVar36] == MF_NORMAL_TRANS_TS)
      {
        local_5ac = 0x3f666666;
        aiMaterial::AddBinaryProperty(this_02,&local_5ac,4,"$mat.opacity",0,0,aiPTI_Float);
        sVar28 = strlen(__s);
        builtin_strncpy(local_470 + sVar28 + 4,"tran",4);
      }
      else {
        sVar28 = strlen(__s);
        builtin_strncpy(local_470 + sVar28 + 4,"opaq",4);
      }
      *(undefined2 *)(local_470 + sVar28 + 8) = 0x5f;
      if ((&(local_5e8.
             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
             _M_impl.super__Vector_impl_data._M_start)->type)[(long)pUVar36] ==
          MF_WEAPON_PLACEHOLDER) {
        local_470._4_4_ = 0x61655724;
        unique0x10001b83 = (pointer)0x246761546e6f70;
        local_470._0_4_ = MF_WEAPON_PLACEHOLDER|MF_NORMAL_MASKED_TS;
        local_588.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
        local_588.super_BaseProcess.shared =
             (SharedPostProcessInfo *)
             ((ulong)local_588.super_BaseProcess.shared & 0xffffffff00000000);
      }
      aiMaterial::AddBinaryProperty(this_02,&local_588,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      sVar28 = strlen(__s);
      local_470._0_4_ = (undefined4)sVar28;
      aiMaterial::AddProperty(this_02,(aiString *)local_470,"?mat.name",0,0);
      _Var5._M_p = stack0xfffffffffffffb98;
      if (local_508.
          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_508.
          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar29 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_508.
                     super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (*(uint *)&(ppVar29->first)._M_dataplus._M_p ==
              (&(local_5e8.
                 super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                 ._M_impl.super__Vector_impl_data._M_start)->tex)[(long)pUVar36]) {
            __n_00 = (pointer)(ppVar29->first).field_2._M_allocated_capacity;
            if (__n_00 < (pointer)0x400) {
              local_470._0_4_ = SUB84(__n_00,0);
              memcpy(__s,(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(ppVar29->first)._M_string_length)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,(size_t)__n_00);
              *(undefined1 *)((long)&(__n_00->_M_dataplus)._M_p + (long)(local_470 + 4)) = 0;
            }
            aiMaterial::AddProperty(this_02,(aiString *)local_470,"$tex.file",1,0);
            _Var5._M_p = stack0xfffffffffffffb98;
            break;
          }
          ppVar29 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&(ppVar29->second)._M_string_length;
        } while (ppVar29 !=
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_508.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppVar38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&(ppVar38->first)._M_dataplus._M_p + 1);
    } while (ppVar38 < (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(ulong)pScene->mNumMeshes);
  }
  acStack_464 = SUB84((ulong)_Var5._M_p >> 0x20,0);
  if (local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar37 = local_558.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_470._0_4_ = SEXT14(pTVar37->mType);
      local_470._4_4_ = ZEXT14(pTVar37->mTextureNum);
      local_470._8_4_ = 0;
      _Var20 = std::
               __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                         (local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_470);
      paVar24 = pScene->mMeshes
                [((ulong)((long)_Var20._M_current -
                         (long)local_5e8.
                               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0xaaaaaaaaaaaaaab]
      ;
      paVar26 = paVar24->mFaces;
      uVar16 = paVar24->mNumFaces;
      paVar24->mNumFaces = uVar16 + 1;
      paVar26[uVar16].mNumIndices = 3;
      puVar23 = (uint *)operator_new__(0xc);
      _Var5._M_p = (pointer)CONCAT44(acStack_464,local_470._8_4_);
      paVar26[uVar16].mIndices = puVar23;
      lVar41 = 0;
      do {
        paVar26[uVar16].mIndices[lVar41] = paVar24->mNumVertices;
        uVar12 = pTVar37->mVertex[lVar41];
        paVar27 = paVar24->mVertices;
        uVar3 = paVar24->mNumVertices;
        paVar27[uVar3].z =
             local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12].z;
        fVar7 = local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar12].y;
        paVar27 = paVar27 + uVar3;
        paVar27->x = local_488.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12].x;
        paVar27->y = fVar7;
        bVar11 = pTVar37->mTex[lVar41][1];
        paVar27 = paVar24->mTextureCoords[0];
        uVar3 = paVar24->mNumVertices;
        paVar27[uVar3].x = (float)pTVar37->mTex[lVar41][0] / 255.0;
        paVar27[uVar3].y = 1.0 - (float)bVar11 / 255.0;
        paVar27[uVar3].z = 0.0;
        lVar41 = lVar41 + 1;
        paVar24->mNumVertices = paVar24->mNumVertices + 1;
      } while (lVar41 != 3);
      pTVar37 = pTVar37 + 1;
    } while (pTVar37 !=
             local_558.
             super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  unique0x10003448 = _Var5._M_p;
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
  MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_470,pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_588);
  FlipWindingOrderProcess::Execute(&local_588,pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_588);
  MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
  if (local_5e8.
      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.
                    super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (stream != (IOStream *)0x0) {
    (*stream->_vptr_IOStream[1])(stream);
  }
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_508);
  if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  StreamReader<false,_false>::~StreamReader(&local_68);
  if (local_558.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.
                    super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.
                          super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.
                          super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  StreamReader<false,_false>::~StreamReader(&local_540);
  (**(code **)(*plVar18 + 8))(plVar18);
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UnrealImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    // For any of the 3 files being passed get the three correct paths
    // First of all, determine file extension
    std::string::size_type pos = pFile.find_last_of('.');
    std::string extension = GetExtension(pFile);

    std::string d_path,a_path,uc_path;
    if (extension == "3d")      {
        // jjjj_d.3d
        // jjjj_a.3d
        pos = pFile.find_last_of('_');
        if (std::string::npos == pos) {
            throw DeadlyImportError("UNREAL: Unexpected naming scheme");
        }
        extension = pFile.substr(0,pos);
    }
    else {
        extension = pFile.substr(0,pos);
    }

    // build proper paths
    d_path  = extension+"_d.3d";
    a_path  = extension+"_a.3d";
    uc_path = extension+".uc";

    ASSIMP_LOG_DEBUG_F( "UNREAL: data file is ", d_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: aniv file is ", a_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: uc file is ", uc_path);

    // and open the files ... we can't live without them
    std::unique_ptr<IOStream> p(pIOHandler->Open(d_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _d file");
    StreamReaderLE d_reader(pIOHandler->Open(d_path));

    const uint16_t numTris = d_reader.GetI2();
    const uint16_t numVert = d_reader.GetI2();
    d_reader.IncPtr(44);
    if (!numTris || numVert < 3)
        throw DeadlyImportError("UNREAL: Invalid number of vertices/triangles");

    // maximum texture index
    unsigned int maxTexIdx = 0;

    // collect triangles
    std::vector<Unreal::Triangle> triangles(numTris);
    for (auto & tri : triangles) {
        for (unsigned int i = 0; i < 3;++i) {

            tri.mVertex[i] = d_reader.GetI2();
            if (tri.mVertex[i] >= numTris)  {
                ASSIMP_LOG_WARN("UNREAL: vertex index out of range");
                tri.mVertex[i] = 0;
            }
        }
        tri.mType = d_reader.GetI1();

        // handle mesh flagss?
        if (configHandleFlags)
            tri.mType = Unreal::MF_NORMAL_OS;
        else {
            // ignore MOD and MASKED for the moment, treat them as two-sided
            if (tri.mType == Unreal::MF_NORMAL_MOD_TS || tri.mType == Unreal::MF_NORMAL_MASKED_TS)
                tri.mType = Unreal::MF_NORMAL_TS;
        }
        d_reader.IncPtr(1);

        for (unsigned int i = 0; i < 3;++i)
            for (unsigned int i2 = 0; i2 < 2;++i2)
                tri.mTex[i][i2] = d_reader.GetI1();

        tri.mTextureNum = d_reader.GetI1();
        maxTexIdx = std::max(maxTexIdx,(unsigned int)tri.mTextureNum);
        d_reader.IncPtr(1);
    }

    p.reset(pIOHandler->Open(a_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _a file");
    StreamReaderLE a_reader(pIOHandler->Open(a_path));

    // read number of frames
    const uint32_t numFrames = a_reader.GetI2();
    if (configFrameID >= numFrames)
        throw DeadlyImportError("UNREAL: The requested frame does not exist");

    uint32_t st = a_reader.GetI2();
    if (st != numVert*4)
        throw DeadlyImportError("UNREAL: Unexpected aniv file length");

    // skip to our frame
    a_reader.IncPtr(configFrameID *numVert*4);

    // collect vertices
    std::vector<aiVector3D> vertices(numVert);
    for (auto &vertex : vertices)    {
        int32_t val = a_reader.GetI4();
        Unreal::DecompressVertex(vertex ,val);
    }

    // list of textures.
    std::vector< std::pair<unsigned int, std::string> > textures;

    // allocate the output scene
    aiNode* nd = pScene->mRootNode = new aiNode();
    nd->mName.Set("<UnrealRoot>");

    // we can live without the uc file if necessary
    std::unique_ptr<IOStream> pb (pIOHandler->Open(uc_path));
    if (pb.get())   {

        std::vector<char> _data;
        TextFileToBuffer(pb.get(),_data);
        const char* data = &_data[0];

        std::vector< std::pair< std::string,std::string > > tempTextures;

        // do a quick search in the UC file for some known, usually texture-related, tags
        for (;*data;++data) {
            if (TokenMatchI(data,"#exec",5))    {
                SkipSpacesAndLineEnd(&data);

                // #exec TEXTURE IMPORT [...] NAME=jjjjj [...] FILE=jjjj.pcx [...]
                if (TokenMatchI(data,"TEXTURE",7))  {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"IMPORT",6))   {
                        tempTextures.push_back(std::pair< std::string,std::string >());
                        std::pair< std::string,std::string >& me = tempTextures.back();
                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NAME=",5)) {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.first = std::string(d,(size_t)(data-d));
                            }
                            else if (!::ASSIMP_strincmp(data,"FILE=",5))    {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));
                            }
                        }
                        if (!me.first.length() || !me.second.length())
                            tempTextures.pop_back();
                    }
                }
                // #exec MESHMAP SETTEXTURE MESHMAP=box NUM=1 TEXTURE=Jtex1
                // #exec MESHMAP SCALE MESHMAP=box X=0.1 Y=0.1 Z=0.2
                else if (TokenMatchI(data,"MESHMAP",7)) {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"SETTEXTURE",10)) {

                        textures.push_back(std::pair<unsigned int, std::string>());
                        std::pair<unsigned int, std::string>& me = textures.back();

                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NUM=",4))  {
                                data += 4;
                                me.first = strtoul10(data,&data);
                            }
                            else if (!::ASSIMP_strincmp(data,"TEXTURE=",8)) {
                                data += 8;
                                const char *d = data;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));

                                // try to find matching path names, doesn't care if we don't find them
                                for (std::vector< std::pair< std::string,std::string > >::const_iterator it = tempTextures.begin();
                                     it != tempTextures.end(); ++it)    {
                                    if ((*it).first == me.second)   {
                                        me.second = (*it).second;
                                        break;
                                    }
                                }
                            }
                        }
                    }
                    else if (TokenMatchI(data,"SCALE",5)) {

                        for (;!IsLineEnd(*data);++data) {
                            if (data[0] == 'X' && data[1] == '=')   {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.a1);
                            }
                            else if (data[0] == 'Y' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.b2);
                            }
                            else if (data[0] == 'Z' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.c3);
                            }
                        }
                    }
                }
            }
        }
    }
    else    {
        ASSIMP_LOG_ERROR("Unable to open .uc file");
    }

    std::vector<Unreal::TempMat> materials;
    materials.reserve(textures.size()*2+5);

    // find out how many output meshes and materials we'll have and build material indices
	for (Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);
        if (nt == materials.end()) {
            // add material
            tri.matIndex = static_cast<unsigned int>(materials.size());
            mat.numFaces = 1;
            materials.push_back(mat);

            ++pScene->mNumMeshes;
        }
        else {
            tri.matIndex = static_cast<unsigned int>(nt-materials.begin());
            ++nt->numFaces;
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError("UNREAL: Unable to find valid mesh data");
    }

    // allocate meshes and bind them to the node graph
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = pScene->mNumMeshes];

    nd->mNumMeshes  = pScene->mNumMeshes;
    nd->mMeshes = new unsigned int[nd->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh* m = pScene->mMeshes[i] =  new aiMesh();
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        const unsigned int num = materials[i].numFaces;
        m->mFaces            = new aiFace     [num];
        m->mVertices         = new aiVector3D [num*3];
        m->mTextureCoords[0] = new aiVector3D [num*3];

        nd->mMeshes[i] = i;

        // create materials, too
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[i] = mat;

        // all white by default - texture rulez
        aiColor3D color(1.f,1.f,1.f);

        aiString s;
        ::ai_snprintf( s.data, MAXLEN, "mat%u_tx%u_",i,materials[i].tex );

        // set the two-sided flag
        if (materials[i].type == Unreal::MF_NORMAL_TS) {
            const int twosided = 1;
            mat->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
            ::strcat(s.data,"ts_");
        }
        else ::strcat(s.data,"os_");

        // make TRANS faces 90% opaque that RemRedundantMaterials won't catch us
        if (materials[i].type == Unreal::MF_NORMAL_TRANS_TS)    {
            const float opac = 0.9f;
            mat->AddProperty(&opac,1,AI_MATKEY_OPACITY);
            ::strcat(s.data,"tran_");
        }
        else ::strcat(s.data,"opaq_");

        // a special name for the weapon attachment point
        if (materials[i].type == Unreal::MF_WEAPON_PLACEHOLDER) {
            s.length = ::ai_snprintf( s.data, MAXLEN, "$WeaponTag$" );
            color = aiColor3D(0.f,0.f,0.f);
        }

        // set color and name
        mat->AddProperty(&color,1,AI_MATKEY_COLOR_DIFFUSE);
        s.length = ::strlen(s.data);
        mat->AddProperty(&s,AI_MATKEY_NAME);

        // set texture, if any
        const unsigned int tex = materials[i].tex;
        for (std::vector< std::pair< unsigned int, std::string > >::const_iterator it = textures.begin();it != textures.end();++it) {
            if ((*it).first == tex) {
                s.Set((*it).second);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                break;
            }
        }
    }

    // fill them.
    for (const Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);

        aiMesh* mesh = pScene->mMeshes[nt-materials.begin()];
        aiFace& f    = mesh->mFaces[mesh->mNumFaces++];
        f.mIndices   = new unsigned int[f.mNumIndices = 3];

        for (unsigned int i = 0; i < 3;++i,mesh->mNumVertices++) {
            f.mIndices[i] = mesh->mNumVertices;

            mesh->mVertices[mesh->mNumVertices] = vertices[ tri.mVertex[i] ];
            mesh->mTextureCoords[0][mesh->mNumVertices] = aiVector3D( tri.mTex[i][0] / 255.f, 1.f - tri.mTex[i][1] / 255.f, 0.f);
        }
    }

    // convert to RH
    MakeLeftHandedProcess hero;
    hero.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}